

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

wchar_t * StringFromUnits(LengthUnitSystem units)

{
  wchar_t *pwStack_10;
  LengthUnitSystem units_local;
  
  switch(units) {
  case Microns:
    pwStack_10 = L"microns";
    break;
  case Millimeters:
    pwStack_10 = L"millimeters";
    break;
  case Centimeters:
    pwStack_10 = L"centimeters";
    break;
  case Meters:
    pwStack_10 = L"meters";
    break;
  case Kilometers:
    pwStack_10 = L"kilometers";
    break;
  case Microinches:
    pwStack_10 = L"microinches";
    break;
  case Mils:
    pwStack_10 = L"mils";
    break;
  case Inches:
    pwStack_10 = L"inches";
    break;
  case Feet:
    pwStack_10 = L"feet";
    break;
  case Miles:
    pwStack_10 = L"miles";
    break;
  default:
    pwStack_10 = L"none";
    break;
  case Angstroms:
    pwStack_10 = L"angstroms";
    break;
  case Nanometers:
    pwStack_10 = L"nanometers";
    break;
  case Decimeters:
    pwStack_10 = L"decimeters";
    break;
  case Dekameters:
    pwStack_10 = L"dekameters";
    break;
  case Hectometers:
    pwStack_10 = L"hectometers";
    break;
  case Megameters:
    pwStack_10 = L"megameters";
    break;
  case Gigameters:
    pwStack_10 = L"gigameters";
    break;
  case Yards:
    pwStack_10 = L"yards";
    break;
  case NauticalMiles:
    pwStack_10 = L"nautical-miles";
    break;
  case AstronomicalUnits:
    pwStack_10 = L"astronomical";
    break;
  case LightYears:
    pwStack_10 = L"lightyears";
    break;
  case Parsecs:
    pwStack_10 = L"parsecs";
  }
  return pwStack_10;
}

Assistant:

static const wchar_t* StringFromUnits(ON::LengthUnitSystem units)
{
  // These strings appear in the XML -- do not change them.

  switch (units)
  {
  case ON::LengthUnitSystem::Angstroms:         return L"angstroms";
  case ON::LengthUnitSystem::AstronomicalUnits: return L"astronomical";
  case ON::LengthUnitSystem::Centimeters:       return L"centimeters";
  case ON::LengthUnitSystem::Decimeters:        return L"decimeters";
  case ON::LengthUnitSystem::Dekameters:        return L"dekameters";
  case ON::LengthUnitSystem::Feet:              return L"feet";
  case ON::LengthUnitSystem::Gigameters:        return L"gigameters";
  case ON::LengthUnitSystem::Hectometers:       return L"hectometers";
  case ON::LengthUnitSystem::Inches:            return L"inches";
  case ON::LengthUnitSystem::Kilometers:        return L"kilometers";
  case ON::LengthUnitSystem::LightYears:        return L"lightyears";
  case ON::LengthUnitSystem::Megameters:        return L"megameters";
  case ON::LengthUnitSystem::Meters:            return L"meters";
  case ON::LengthUnitSystem::Microinches:       return L"microinches";
  case ON::LengthUnitSystem::Microns:           return L"microns";
  case ON::LengthUnitSystem::Miles:             return L"miles";
  case ON::LengthUnitSystem::Millimeters:       return L"millimeters";
  case ON::LengthUnitSystem::Mils:              return L"mils";
  case ON::LengthUnitSystem::Nanometers:        return L"nanometers";
  case ON::LengthUnitSystem::NauticalMiles:     return L"nautical-miles";
  case ON::LengthUnitSystem::Parsecs:           return L"parsecs";
  case ON::LengthUnitSystem::Yards:             return L"yards";
    default:
        break;
  }

  return L"none";
}